

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::updateWindowSize(GLEngine *this,bool force)

{
  undefined7 in_register_00000031;
  int newWindowHeight;
  int newWindowWidth;
  int newBufferHeight;
  int newBufferWidth;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  glfwGetFramebufferSize(this->mainWindow,&local_14,&local_18);
  glfwGetWindowSize(this->mainWindow,&local_1c,&local_20);
  if (((((int)CONCAT71(in_register_00000031,force) != 0) || (local_14 != view::bufferWidth)) ||
      (local_18 != view::bufferHeight)) ||
     ((local_20 != view::windowHeight || (local_1c != view::windowWidth)))) {
    requestRedraw();
    view::bufferWidth = local_14;
    view::bufferHeight = local_18;
    view::windowWidth = local_1c;
    view::windowHeight = local_20;
    (**(code **)(*engine + 0x38))();
    (**(code **)(*engine + 0x40))();
  }
  return;
}

Assistant:

void GLEngine::updateWindowSize(bool force) {
  int newBufferWidth, newBufferHeight, newWindowWidth, newWindowHeight;
  glfwGetFramebufferSize(mainWindow, &newBufferWidth, &newBufferHeight);
  glfwGetWindowSize(mainWindow, &newWindowWidth, &newWindowHeight);
  if (force || newBufferWidth != view::bufferWidth || newBufferHeight != view::bufferHeight ||
      newWindowHeight != view::windowHeight || newWindowWidth != view::windowWidth) {
    // Basically a resize callback
    requestRedraw();
    view::bufferWidth = newBufferWidth;
    view::bufferHeight = newBufferHeight;
    view::windowWidth = newWindowWidth;
    view::windowHeight = newWindowHeight;

    render::engine->resizeScreenBuffers();
    render::engine->setScreenBufferViewports();
  }
}